

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void filter_8_2t_pixels(__m128i *sig,__m128i *f,__m128i *y0,__m128i *y1)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m128i alVar4;
  __m128i x1;
  __m128i x0;
  __m128i rounding;
  __m128i *y1_local;
  __m128i *y0_local;
  __m128i *f_local;
  __m128i *sig_local;
  
  auVar1 = vpinsrd_avx(ZEXT416(0x40),0x40,1);
  auVar1 = vpinsrd_avx(auVar1,0x40,2);
  auVar2 = vpinsrd_avx(auVar1,0x40,3);
  auVar1 = vpmaddwd_avx((undefined1  [16])*sig,(undefined1  [16])*f);
  auVar3 = vpmaddwd_avx((undefined1  [16])sig[1],(undefined1  [16])*f);
  auVar1 = vpaddd_avx(auVar1,auVar2);
  auVar2 = vpaddd_avx(auVar3,auVar2);
  alVar4 = (__m128i)vpsrad_avx(auVar1,ZEXT416(7));
  *y0 = alVar4;
  alVar4 = (__m128i)vpsrad_avx(auVar2,ZEXT416(7));
  *y1 = alVar4;
  return;
}

Assistant:

static inline void filter_8_2t_pixels(const __m128i *sig, const __m128i *f,
                                      __m128i *y0, __m128i *y1) {
  const __m128i rounding = _mm_set1_epi32(1 << (CONV8_ROUNDING_BITS - 1));
  __m128i x0 = _mm_madd_epi16(sig[0], *f);
  __m128i x1 = _mm_madd_epi16(sig[1], *f);
  x0 = _mm_add_epi32(x0, rounding);
  x1 = _mm_add_epi32(x1, rounding);
  *y0 = _mm_srai_epi32(x0, CONV8_ROUNDING_BITS);
  *y1 = _mm_srai_epi32(x1, CONV8_ROUNDING_BITS);
}